

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

Maybe<kj::Own<capnp::ClientHook>_> __thiscall
capnp::anon_unknown_0::MembraneCapTableBuilder::extractCap(MembraneCapTableBuilder *this,uint index)

{
  undefined4 in_EDX;
  ClientHook *extraout_RDX;
  undefined4 in_register_00000034;
  Maybe<kj::Own<capnp::ClientHook>_> MVar1;
  Maybe<kj::Own<capnp::ClientHook>_> local_30;
  long lStack_18;
  uint index_local;
  MembraneCapTableBuilder *this_local;
  
  lStack_18 = CONCAT44(in_register_00000034,index);
  this_local = this;
  (**(code **)**(undefined8 **)(lStack_18 + 8))(&local_30,*(undefined8 **)(lStack_18 + 8),in_EDX);
  kj::Maybe<kj::Own<capnp::ClientHook>_>::
  map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_c__:97:41)>
            ((Maybe<kj::Own<capnp::ClientHook>_> *)this,(anon_class_8_1_8991fb9c *)&local_30);
  kj::Maybe<kj::Own<capnp::ClientHook>_>::~Maybe(&local_30);
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook>_>)MVar1.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> extractCap(uint index) override {
    // The underlying message is inside the membrane, and we're pulling a cap out of it. Therefore,
    // we want to wrap the extracted capability in the membrane.
    return inner->extractCap(index).map([this](kj::Own<ClientHook>&& cap) {
      return membrane(kj::mv(cap), policy, reverse);
    });
  }